

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmElseIfCommand.cxx
# Opt level: O2

bool __thiscall
cmElseIfCommand::InitialPass
          (cmElseIfCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             "An ELSEIF command was found outside of a proper IF ENDIF structure.",&local_31);
  cmCommand::SetError(&this->super_cmCommand,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool cmElseIfCommand::InitialPass(std::vector<std::string> const&,
                                  cmExecutionStatus &)
{
  this->SetError("An ELSEIF command was found outside of a proper "
                 "IF ENDIF structure.");
  return false;
}